

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_details.cxx
# Opt level: O2

void __thiscall xray_re::details_header::save(details_header *this,xr_writer *w)

{
  undefined1 local_24 [4];
  
  (*w->_vptr_xr_writer[2])(w,local_24,4);
  (*w->_vptr_xr_writer[2])(w,local_24,4);
  (*w->_vptr_xr_writer[2])(w,local_24,4);
  (*w->_vptr_xr_writer[2])(w,local_24,4);
  (*w->_vptr_xr_writer[2])(w,local_24,4);
  (*w->_vptr_xr_writer[2])(w,local_24,4);
  return;
}

Assistant:

void details_header::save(xr_writer& w) const
{
	w.w_u32(version);
	w.w_u32(object_count);
	w.w_s32(offs_x);
	w.w_s32(offs_z);
	w.w_u32(size_x);
	w.w_u32(size_z);
}